

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS ref_cell_tec_fill(REF_CELL ref_cell,char *filename)

{
  REF_STATUS RVar1;
  FILE *__s;
  uint cell;
  long lVar2;
  REF_INT nodes [27];
  REF_INT aRStack_a8 [30];
  
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x5eb,
           "ref_cell_tec_fill","unable to open file");
    RVar1 = 2;
  }
  else {
    fwrite("title=\"tecplot refine cell fill\"\n",0x21,1,__s);
    fwrite("variables = \"node\" \"cell\"\n",0x1a,1,__s);
    fprintf(__s,"zone t=\"fill\", i=%d, datapacking=%s\n",
            (ulong)(uint)(ref_cell->n * ref_cell->node_per),"point");
    if (0 < ref_cell->max) {
      cell = 0;
      do {
        RVar1 = ref_cell_nodes(ref_cell,cell,aRStack_a8);
        if ((RVar1 == 0) && (0 < ref_cell->node_per)) {
          lVar2 = 0;
          do {
            fprintf(__s," %d %d\n",
                    (ulong)(uint)ref_cell->c2n[(long)ref_cell->size_per * (long)(int)cell + lVar2],
                    (ulong)cell);
            lVar2 = lVar2 + 1;
          } while ((int)lVar2 < ref_cell->node_per);
        }
        cell = cell + 1;
      } while ((int)cell < ref_cell->max);
    }
    fclose(__s);
    RVar1 = 0;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_cell_tec_fill(REF_CELL ref_cell, const char *filename) {
  REF_INT cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine cell fill\"\n");
  fprintf(file, "variables = \"node\" \"cell\"\n");

  fprintf(file, "zone t=\"fill\", i=%d, datapacking=%s\n",
          ref_cell_node_per(ref_cell) * ref_cell_n(ref_cell), "point");

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    each_ref_cell_cell_node(ref_cell, cell_node) {
      fprintf(file, " %d %d\n", ref_cell_c2n(ref_cell, cell_node, cell), cell);
    }
  }

  fclose(file);

  return REF_SUCCESS;
}